

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  char *pcVar1;
  bool bVar2;
  deUint32 queueFamilyIndex_;
  iterator beg;
  iterator end;
  VkAllocationCallbacks *pVVar3;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  reference this;
  char **value;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  char *local_5e0;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  allocator<char> local_591;
  string local_590;
  Handle<(vk::HandleType)18> local_570;
  uint local_568;
  int local_564;
  deUint32 nullNdx;
  undefined1 local_3e0 [8];
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  Resources res;
  MessageBuilder local_2d0;
  undefined1 local_150 [8];
  Environment objEnv;
  AllocationCallbackRecorder recorder;
  DeterministicFailAllocator objAllocator;
  VkResult local_58 [2];
  VkResult result;
  allocator<vk::Handle<(vk::HandleType)18>_> local_41;
  undefined1 local_40 [8];
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> handles;
  deUint32 numPassingAllocs;
  bool expectNullHandles;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  handles.
  super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       api::(anonymous_namespace)::isNullHandleOnAllocationFailure<vk::Handle<(vk::HandleType)18>>
                 (context);
  handles.
  super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::allocator<vk::Handle<(vk::HandleType)18>_>::allocator(&local_41);
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> *
         )local_40,4,&local_41);
  std::allocator<vk::Handle<(vk::HandleType)18>_>::~allocator(&local_41);
  local_58[0] = VK_NOT_READY;
  do {
    if (4 < (uint)handles.
                  super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_007cd6da:
      local_564 = 0;
LAB_007cd6e4:
      std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ::~vector((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                 *)local_40);
      if (local_564 == 0) {
        if ((uint)handles.
                  super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
          bVar2 = api::(anonymous_namespace)::isPooledObject<vk::Handle<(vk::HandleType)18>>();
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_628,
                       "Not validated: pooled objects didn\'t seem to use host memory",&local_629);
            tcu::TestStatus::pass(__return_storage_ptr__,&local_628);
            std::__cxx11::string::~string((string *)&local_628);
            std::allocator<char>::~allocator(&local_629);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_650,"Allocation callbacks not called",&local_651);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_650);
            std::__cxx11::string::~string((string *)&local_650);
            std::allocator<char>::~allocator(&local_651);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"Ok",&local_679);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_678);
          std::__cxx11::string::~string((string *)&local_678);
          std::allocator<char>::~allocator(&local_679);
        }
      }
      return __return_storage_ptr__;
    }
    beg = std::
          vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
          begin((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                 *)local_40);
    end = std::
          vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
          end((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
               *)local_40);
    ::vk::ValidateQueryBits::
    fillBits<__gnu_cxx::__normal_iterator<vk::Handle<(vk::HandleType)18>*,std::vector<vk::Handle<(vk::HandleType)18>,std::allocator<vk::Handle<(vk::HandleType)18>>>>>
              ((__normal_iterator<vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
                )beg._M_current,
               (__normal_iterator<vk::Handle<(vk::HandleType)18>_*,_std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>_>
                )end._M_current,0xde);
    pVVar3 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,pVVar3,MODE_DO_NOT_COUNT,0);
    pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&recorder.m_records.m_last);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar3,0x80);
    vkp_ = Context::getPlatformInterface(context);
    vkd_ = Context::getDeviceInterface(context);
    device_ = Context::getDevice(context);
    queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex(context);
    programBinaries_ = Context::getBinaryCollection(context);
    pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
    Environment::Environment
              ((Environment *)local_150,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar3,
               4);
    pTVar4 = Context::getTestContext(context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_2d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [18])"Trying to create ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,&allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
                                ::numObjects);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" objects with ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(uint *)&handles.
                                        super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])" allocation");
    pcVar1 = ",\n\t\t";
    if ((uint)handles.
              super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != 1) {
      pcVar1 = "%s<%s";
    }
    res.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)(pcVar1 + 4);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char **)&res.pipelineCache.object.
                                         super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
                                         deleter.m_allocator);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])" passing");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2d0);
    GraphicsPipeline::Resources::Resources
              ((Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Environment *)local_150,
               (Parameters *)((long)&context_local + 7));
    ::vk::DeterministicFailAllocator::reset
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,MODE_COUNT_AND_FAIL,
               (uint)handles.
                     super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    GraphicsPipeline::createMultiple
              ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                *)local_3e0,(Environment *)local_150,
               (Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (Parameters *)((long)&context_local + 7),
               (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                *)local_40,local_58);
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
               *)local_3e0);
    GraphicsPipeline::Resources::~Resources
              ((Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_58[0] == VK_SUCCESS) {
      pTVar4 = Context::getTestContext(context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&nullNdx,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&nullNdx,
                          (char (*) [40])"Construction of all objects succeeded! ");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&nullNdx);
      local_564 = 2;
    }
    else {
      if ((handles.
           super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        for (local_568 = (uint)handles.
                               super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage; local_568 < 4;
            local_568 = local_568 + 1) {
          this = std::
                 vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                 ::operator[]((vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                               *)local_40,(ulong)local_568);
          ::vk::Handle<(vk::HandleType)18>::Handle(&local_570,0);
          bVar2 = ::vk::Handle<(vk::HandleType)18>::operator!=(this,&local_570);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_590,"Some object handles weren\'t set to NULL",&local_591);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_590);
            std::__cxx11::string::~string((string *)&local_590);
            std::allocator<char>::~allocator(&local_591);
            local_564 = 1;
            goto LAB_007cd676;
          }
        }
      }
      if (local_58[0] == VK_ERROR_OUT_OF_HOST_MEMORY) {
        pTVar4 = Context::getTestContext(context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        bVar2 = ::vk::validateAndLog
                          (pTVar5,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
        if (bVar2) {
          local_564 = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_600,"Invalid allocation callback",&local_601);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_600);
          std::__cxx11::string::~string((string *)&local_600);
          std::allocator<char>::~allocator(&local_601);
          local_564 = 1;
        }
      }
      else {
        local_5e0 = ::vk::getResultName(local_58[0]);
        de::toString<char_const*>(&local_5d8,(de *)&local_5e0,value);
        std::operator+(&local_5b8,"Got invalid error code: ",&local_5d8);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_5b8);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_5d8);
        local_564 = 1;
      }
    }
LAB_007cd676:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last);
    if (local_564 != 0) {
      if (local_564 != 2) goto LAB_007cd6e4;
      goto LAB_007cd6da;
    }
    handles.
    super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)handles.
               super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}